

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyCloneNode(TidyDocImpl *doc,Node *element)

{
  uint uVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *pNVar4;
  tmbstr ptVar5;
  AttVal *pAVar6;
  
  pLVar2 = doc->lexer;
  pNVar4 = (Node *)(*pLVar2->allocator->vtbl->alloc)(pLVar2->allocator,0x70);
  pNVar4->parent = (Node *)0x0;
  pNVar4->prev = (Node *)0x0;
  pNVar4->next = (Node *)0x0;
  pNVar4->content = (Node *)0x0;
  pNVar4->last = (Node *)0x0;
  pNVar4->attributes = (AttVal *)0x0;
  pNVar4->was = (Dict *)0x0;
  pNVar4->tag = (Dict *)0x0;
  pNVar4->element = (tmbstr)0x0;
  pNVar4->start = 0;
  pNVar4->end = 0;
  pNVar4->type = RootNode;
  pNVar4->line = 0;
  pNVar4->column = 0;
  pNVar4->idx = 0;
  pNVar4->closed = no;
  pNVar4->implicit = no;
  *(undefined8 *)&pNVar4->linebreak = 0;
  uVar1 = pLVar2->columns;
  pNVar4->line = pLVar2->lines;
  pNVar4->column = uVar1;
  pNVar4->type = TextNode;
  uVar1 = pLVar2->lexsize;
  pNVar4->start = uVar1;
  pNVar4->end = uVar1;
  if (element != (Node *)0x0) {
    pNVar4->parent = element->parent;
    pNVar4->type = element->type;
    BVar3 = element->implicit;
    pNVar4->closed = element->closed;
    pNVar4->implicit = BVar3;
    pNVar4->tag = element->tag;
    ptVar5 = prvTidytmbstrdup(doc->allocator,element->element);
    pNVar4->element = ptVar5;
    pAVar6 = prvTidyDupAttrs(doc,element->attributes);
    pNVar4->attributes = pAVar6;
  }
  return pNVar4;
}

Assistant:

Node *TY_(CloneNode)( TidyDocImpl* doc, Node *element )
{
    Lexer* lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );

    node->start = lexer->lexsize;
    node->end   = lexer->lexsize;

    if ( element )
    {
        node->parent     = element->parent;
        node->type       = element->type;
        node->closed     = element->closed;
        node->implicit   = element->implicit;
        node->tag        = element->tag;
        node->element    = TY_(tmbstrdup)( doc->allocator, element->element );
        node->attributes = TY_(DupAttrs)( doc, element->attributes );
    }
    return node;
}